

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O1

void __thiscall
ScenePreprocessorTest::CheckIfOnly(ScenePreprocessorTest *this,aiMesh *p,uint num,uint flag)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  uint local_24;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  if (p->mNumFaces != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      *(uint *)((long)&p->mFaces->mNumIndices + lVar2) = num;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < p->mNumFaces);
  }
  local_24 = flag;
  Assimp::ScenePreprocessor::ProcessMesh(this->mScenePreprocessor,p);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_20,"flag","p->mPrimitiveTypes",&local_24,&p->mPrimitiveTypes);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x6a,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  p->mPrimitiveTypes = 0;
  return;
}

Assistant:

void ScenePreprocessorTest::CheckIfOnly(aiMesh* p, unsigned int num, unsigned int flag) {
    // Triangles only
    for (unsigned i = 0; i < p->mNumFaces;++i) {
        p->mFaces[i].mNumIndices = num;
    }
    mScenePreprocessor->ProcessMesh(p);
    EXPECT_EQ(flag, p->mPrimitiveTypes);
    p->mPrimitiveTypes = 0;
}